

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getmodel.cpp
# Opt level: O0

void __thiscall getmodel::doCdfInnerNoIntensityUncertaintyz(getmodel *this,FILE *fin,int event_id)

{
  FILE *__stream;
  size_type sVar1;
  mapped_type *pmVar2;
  reference pvVar3;
  reference pvVar4;
  size_type sVar5;
  AREAPERIL_INT local_54;
  undefined1 local_4d;
  int local_4c;
  bool do_cdf_for_area_peril;
  AREAPERIL_INT *pAStack_48;
  int i;
  EventRow *event_key;
  int number_of_event_records;
  int ret;
  uLong dest_length;
  ulong uStack_28;
  int size;
  unsigned_long sizeof_EventKey;
  FILE *pFStack_18;
  int event_id_local;
  FILE *fin_local;
  getmodel *this_local;
  
  uStack_28 = 0xc;
  sizeof_EventKey._4_4_ = event_id;
  pFStack_18 = (FILE *)fin;
  fin_local = (FILE *)this;
  sVar1 = std::
          map<int,_EventIndex,_std::less<int>,_std::allocator<std::pair<const_int,_EventIndex>_>_>::
          count(&this->_event_index_by_event_id,(key_type *)((long)&sizeof_EventKey + 4));
  __stream = pFStack_18;
  if (sVar1 != 0) {
    pmVar2 = std::
             map<int,_EventIndex,_std::less<int>,_std::allocator<std::pair<const_int,_EventIndex>_>_>
             ::operator[](&this->_event_index_by_event_id,(key_type *)((long)&sizeof_EventKey + 4));
    fseek(__stream,pmVar2->offset,0);
    pmVar2 = std::
             map<int,_EventIndex,_std::less<int>,_std::allocator<std::pair<const_int,_EventIndex>_>_>
             ::operator[](&this->_event_index_by_event_id,(key_type *)((long)&sizeof_EventKey + 4));
    dest_length._4_4_ = (int)pmVar2->size;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->_compressed_buf,(long)(dest_length._4_4_ + 1));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->_uncompressed_buf,(long)(dest_length._4_4_ * 0x14));
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->_compressed_buf,0);
    fread(pvVar3,(long)dest_length._4_4_,1,pFStack_18);
    _number_of_event_records =
         std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->_uncompressed_buf);
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->_uncompressed_buf,0);
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->_compressed_buf,0);
    event_key._4_4_ = uncompress(pvVar3,&number_of_event_records,pvVar4);
    if (event_key._4_4_ != 0) {
      fprintf(_stderr,"FATAL: Got bad return code from uncompress %d\n",(ulong)event_key._4_4_);
      exit(-1);
    }
    event_key._0_4_ = (int)(_number_of_event_records / uStack_28);
    pAStack_48 = (AREAPERIL_INT *)
                 std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (&this->_uncompressed_buf,0);
    for (local_4c = 0; local_4c < (int)event_key; local_4c = local_4c + 1) {
      local_54 = *pAStack_48;
      sVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                        (&this->_area_perils,(key_type *)&local_54);
      local_4d = sVar5 == 1;
      if ((bool)local_4d) {
        doResultsNoIntensityUncertainty
                  (this,(int *)((long)&sizeof_EventKey + 4),pAStack_48,
                   &this->_vulnerability_ids_by_area_peril,&this->_vulnerabilities,pAStack_48[1]);
      }
      pAStack_48 = pAStack_48 + 3;
    }
  }
  return;
}

Assistant:

void getmodel::doCdfInnerNoIntensityUncertaintyz(FILE* fin, int event_id) {
  auto sizeof_EventKey = sizeof(EventRow);
  if (_event_index_by_event_id.count(event_id) == 0)
    return;
  flseek(fin, _event_index_by_event_id[event_id].offset, 0);
  int size = _event_index_by_event_id[event_id].size;
  _compressed_buf.resize(size + 1);
  _uncompressed_buf.resize(size * 20);
  fread(&_compressed_buf[0], size, 1, fin);
  uLong dest_length = _uncompressed_buf.size();
  int ret = uncompress(&_uncompressed_buf[0], &dest_length,
                        &_compressed_buf[0], size);
  if (ret != Z_OK) {
    fprintf(stderr, "FATAL: Got bad return code from uncompress %d\n", ret);
    exit(-1);
  }    
  // we now have the data length
  int number_of_event_records =
      static_cast<int>(dest_length / sizeof_EventKey);
  EventRow *event_key = (EventRow *)&_uncompressed_buf[0];
  for (int i = 0; i < number_of_event_records; i++) {
    bool do_cdf_for_area_peril =
        (_area_perils.count(event_key->areaperil_id) == 1);
    if (do_cdf_for_area_peril) {
      // Generate and write the results
      doResultsNoIntensityUncertainty(
          event_id, event_key->areaperil_id, _vulnerability_ids_by_area_peril,
          _vulnerabilities, event_key->intensity_bin_id);
    }
    event_key++;
  }
}